

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.h
# Opt level: O3

Node<MeshLib::Face> * __thiscall
AVL::Node<MeshLib::Face>::insert_node(Node<MeshLib::Face> *this,Face *inData)

{
  bool bVar1;
  Node<MeshLib::Face> *pNVar2;
  
  bVar1 = this->data->m_id < inData->m_id;
  pNVar2 = insert_node((&this->left)[bVar1],inData);
  (&this->left)[bVar1] = pNVar2;
  pNVar2 = balance(this);
  return pNVar2;
}

Assistant:

Node<T> * insert_node (T  *  inData)
    {
        if (this == NULL)
            return new Node<T> (inData);

        if ( *inData < *data)
            left = left -> insert_node (inData);
        else
            right = right -> insert_node (inData);
        return balance ();
    }